

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O2

rt_expression_interface<double> * __thiscall
viennamath::
op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
::diff(op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
       *this,rt_expression_interface<double> *e,rt_expression_interface<double> *diff_var)

{
  rt_expression_interface<double> *prVar1;
  op_rt_integral<viennamath::rt_expression_interface<double>_> oStack_38;
  
  op_rt_integral<viennamath::rt_expression_interface<double>_>::op_rt_integral
            (&oStack_38,&this->unary_op_);
  prVar1 = diff_impl<viennamath::rt_expression_interface<double>>(e,&oStack_38,diff_var);
  rt_interval<viennamath::rt_expression_interface<double>_>::~rt_interval(&oStack_38.interval_);
  return prVar1;
}

Assistant:

InterfaceType * diff(const InterfaceType * e,
                           const InterfaceType * diff_var) const
      {
        return diff_impl(e, unary_op_, diff_var);
      }